

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void OpenSteer::deferredDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 uStack_50;
  Color CStack_40;
  
  Color::Color(&CStack_40);
  puVar6 = DAT_0017abd8;
  puVar5 = (anonymous_namespace)::DeferredLine::lines;
  uVar1 = startPoint->z;
  uVar3._0_4_ = startPoint->x;
  uVar3._4_4_ = startPoint->y;
  uStack_50 = CONCAT44(endPoint->x,uVar1);
  uVar2._0_4_ = endPoint->y;
  uVar2._4_4_ = endPoint->z;
  CStack_40.r_ = color->r_;
  CStack_40.g_ = color->g_;
  CStack_40.b_ = color->b_;
  CStack_40.a_ = color->a_;
  if (DAT_0017abd8 == DAT_0017abe0) {
    lVar12 = (long)DAT_0017abd8 - (long)(anonymous_namespace)::DeferredLine::lines;
    if (lVar12 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (lVar12 >> 3) * -0x3333333333333333;
    uVar7 = 1;
    if (DAT_0017abd8 != (anonymous_namespace)::DeferredLine::lines) {
      uVar7 = uVar10;
    }
    uVar11 = uVar7 + uVar10;
    if (0x333333333333332 < uVar11) {
      uVar11 = 0x333333333333333;
    }
    if (CARRY8(uVar7,uVar10)) {
      uVar11 = 0x333333333333333;
    }
    puVar8 = (undefined8 *)operator_new(uVar11 * 0x28);
    *(undefined8 *)((long)puVar8 + lVar12) = uVar3;
    ((undefined8 *)((long)puVar8 + lVar12))[1] = uStack_50;
    puVar13 = (undefined8 *)((long)puVar8 + lVar12 + 0x10);
    *puVar13 = uVar2;
    puVar13[1] = CStack_40._0_8_;
    *(undefined8 *)((long)puVar8 + lVar12 + 0x20) = CStack_40._8_8_;
    puVar13 = puVar8;
    for (puVar9 = puVar5; puVar6 != puVar9; puVar9 = puVar9 + 5) {
      puVar13[4] = puVar9[4];
      uVar2 = *puVar9;
      uVar3 = puVar9[1];
      uVar4 = puVar9[3];
      puVar13[2] = puVar9[2];
      puVar13[3] = uVar4;
      *puVar13 = uVar2;
      puVar13[1] = uVar3;
      puVar13 = puVar13 + 5;
    }
    if (puVar5 != (undefined8 *)0x0) {
      operator_delete(puVar5,(long)DAT_0017abe0 - (long)puVar5);
    }
    DAT_0017abe0 = puVar8 + uVar11 * 5;
    (anonymous_namespace)::DeferredLine::lines = puVar8;
  }
  else {
    DAT_0017abd8[4] = CStack_40._8_8_;
    DAT_0017abd8[2] = uVar2;
    DAT_0017abd8[3] = CStack_40._0_8_;
    *DAT_0017abd8 = uVar3;
    DAT_0017abd8[1] = uStack_50;
    puVar13 = DAT_0017abd8;
  }
  DAT_0017abd8 = puVar13 + 5;
  return;
}

Assistant:

void 
OpenSteer::deferredDrawLine (const Vec3& startPoint,
                             const Vec3& endPoint,
                             const Color& color)
{
    DeferredLine::addToBuffer (startPoint, endPoint, color);
}